

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

PluralOperand icu_63::tokenTypeToPluralOperand(tokenType tt)

{
  PluralOperand PVar1;
  
  PVar1 = PLURAL_OPERAND_N;
  if (tt - tVariableI < 4) {
    PVar1 = *(PluralOperand *)(&DAT_002ea830 + (ulong)(tt - tVariableI) * 4);
  }
  return PVar1;
}

Assistant:

PluralOperand tokenTypeToPluralOperand(tokenType tt) {
    switch(tt) {
    case tVariableN:
        return PLURAL_OPERAND_N;
    case tVariableI:
        return PLURAL_OPERAND_I;
    case tVariableF:
        return PLURAL_OPERAND_F;
    case tVariableV:
        return PLURAL_OPERAND_V;
    case tVariableT:
        return PLURAL_OPERAND_T;
    default:
        U_ASSERT(FALSE);  // unexpected.
        return PLURAL_OPERAND_N;
    }
}